

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::IntegerFunctionCase::~IntegerFunctionCase(IntegerFunctionCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IntegerFunctionCase_021597f0;
  if (this->m_executor != (ShaderExecutor *)0x0) {
    (*this->m_executor->_vptr_ShaderExecutor[1])();
  }
  this->m_executor = (ShaderExecutor *)0x0;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_failMsg);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->m_failMsg).super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  pcVar2 = (this->m_spec).source._M_dataplus._M_p;
  paVar1 = &(this->m_spec).source.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_spec).globalDeclarations._M_dataplus._M_p;
  paVar1 = &(this->m_spec).globalDeclarations.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector(&(this->m_spec).outputs);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector(&(this->m_spec).inputs);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

IntegerFunctionCase::~IntegerFunctionCase (void)
{
	IntegerFunctionCase::deinit();
}